

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnniint8.cpp
# Opt level: O0

void ncnn::pack_B_tile_int8_avxvnniint8(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int in_stack_00000138;
  int in_stack_0000013c;
  int in_stack_00000140;
  int in_stack_00000144;
  Mat *in_stack_00000148;
  Mat *in_stack_00000150;
  
  pack_B_tile_int8(in_stack_00000150,in_stack_00000148,in_stack_00000144,in_stack_00000140,
                   in_stack_0000013c,in_stack_00000138);
  return;
}

Assistant:

void pack_B_tile_int8_avxvnniint8(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}